

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_lzcomp_internal.cpp
# Opt level: O3

void __thiscall
lzham::lzcompressor::parse_job_callback(lzcompressor *this,uint64 data,void *pData_ptr)

{
  atomic32_t *paVar1;
  int iVar2;
  
  if ((((this->m_params).m_lzham_compress_flags & 2) == 0) ||
     ((this->m_params).m_compression_level != cCompressionLevelUber)) {
    optimal_parse(this,this->m_parse_thread_state + (data & 0xffffffff));
  }
  else {
    extreme_parse(this,this->m_parse_thread_state + (data & 0xffffffff));
  }
  LOCK();
  paVar1 = &this->m_parse_jobs_remaining;
  *paVar1 = *paVar1 + -1;
  UNLOCK();
  if (*paVar1 == 0) {
    iVar2 = sem_post((sem_t *)&this->m_parse_jobs_complete);
    if (iVar2 != 0) {
      lzham_fail("\"semaphore: sem_post() or sem_post_multiple() failed\"",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/raedwulf[P]liblzham/src/comp/lzham_pthreads_threading.h"
                 ,0x3b);
      return;
    }
  }
  return;
}

Assistant:

void lzcompressor::parse_job_callback(uint64 data, void* pData_ptr)
   {
      const uint parse_job_index = (uint)data;
      scoped_perf_section parse_job_timer(cVarArgs, "parse_job_callback %u", parse_job_index);

      (void)pData_ptr;

      parse_thread_state &parse_state = m_parse_thread_state[parse_job_index];

#if 0
      if (m_params.m_compression_level == cCompressionLevelFastest)
         greedy_parse(parse_state);
      else
#endif
      if ((m_params.m_lzham_compress_flags & LZHAM_COMP_FLAG_EXTREME_PARSING) && (m_params.m_compression_level == cCompressionLevelUber))
         extreme_parse(parse_state);
      else
         optimal_parse(parse_state);

      LZHAM_MEMORY_EXPORT_BARRIER

      if (atomic_decrement32(&m_parse_jobs_remaining) == 0)
      {
         m_parse_jobs_complete.release();
      }
   }